

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackinghelpers.h
# Opt level: O2

void duckdb_fastpforlib::internal::fastunpack_quarter(uint8_t *in,uint8_t *out,uint32_t bit)

{
  logic_error *this;
  
  switch(bit) {
  case 0:
    duckdb_fastpforlib::internal::__fastunpack0(in,out);
    return;
  case 1:
    duckdb_fastpforlib::internal::__fastunpack1(in,out);
    return;
  case 2:
    duckdb_fastpforlib::internal::__fastunpack2(in,out);
    return;
  case 3:
    duckdb_fastpforlib::internal::__fastunpack3(in,out);
    return;
  case 4:
    duckdb_fastpforlib::internal::__fastunpack4(in,out);
    return;
  case 5:
    duckdb_fastpforlib::internal::__fastunpack5(in,out);
    return;
  case 6:
    duckdb_fastpforlib::internal::__fastunpack6(in,out);
    return;
  case 7:
    duckdb_fastpforlib::internal::__fastunpack7(in,out);
    return;
  case 8:
    duckdb_fastpforlib::internal::__fastunpack8(in,out);
    return;
  default:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"Invalid bit width for bitpacking");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
}

Assistant:

inline void fastunpack_quarter(const uint8_t *__restrict in, uint8_t *__restrict out, const uint32_t bit) {
	// Could have used function pointers instead of switch.
	// Switch calls do offer the compiler more opportunities for optimization in
	// theory. In this case, it makes no difference with a good compiler.
	switch (bit) {
	case 0:
		internal::__fastunpack0(in, out);
		break;
	case 1:
		internal::__fastunpack1(in, out);
		break;
	case 2:
		internal::__fastunpack2(in, out);
		break;
	case 3:
		internal::__fastunpack3(in, out);
		break;
	case 4:
		internal::__fastunpack4(in, out);
		break;
	case 5:
		internal::__fastunpack5(in, out);
		break;
	case 6:
		internal::__fastunpack6(in, out);
		break;
	case 7:
		internal::__fastunpack7(in, out);
		break;
	case 8:
		internal::__fastunpack8(in, out);
		break;
	default:
		throw std::logic_error("Invalid bit width for bitpacking");
	}
}